

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void __thiscall ON_FixedSizePool::ReturnAll(ON_FixedSizePool *this)

{
  size_t sVar1;
  ON_FixedSizePool *this_local;
  
  if (this->m_first_block != (void *)0x0) {
    this->m_al_element_stack = (void *)0x0;
    this->m_al_block = this->m_first_block;
    this->m_al_element_array = (void *)((long)this->m_al_block + 0x10);
    sVar1 = BlockElementCapacity(this,this->m_first_block);
    this->m_al_count = sVar1;
    this->m_active_element_count = 0;
    this->m_total_element_count = 0;
  }
  return;
}

Assistant:

void ON_FixedSizePool::ReturnAll()
{
  if ( 0 != m_first_block )
  {
    // initialize
    m_al_element_stack = 0;
    //////m_qwerty_it_block = 0;
    //////m_qwerty_it_element = 0;
    m_al_block = m_first_block;
    m_al_element_array = (void*)(((char*)m_al_block) + 2*sizeof(void*));
    m_al_count = BlockElementCapacity(m_first_block);
    m_active_element_count = 0;
    m_total_element_count = 0;
  }
}